

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O3

bool Assimp::SceneCombiner::FindNameMatch
               (aiString *name,
               vector<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_> *input,uint cur)

{
  pointer pSVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  _Rb_tree_color _Var6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  char *__s;
  bool bVar13;
  
  uVar3 = name->length;
  __s = name->data;
  if (uVar3 == 0) {
    sVar4 = strlen(__s);
    uVar3 = (uint)sVar4;
  }
  uVar7 = 0;
  if (3 < uVar3) {
    uVar2 = uVar3 >> 2;
    uVar7 = 0;
    do {
      uVar7 = (*(ushort *)__s + uVar7) * 0x10000 ^
              (uint)*(ushort *)(__s + 2) << 0xb ^ *(ushort *)__s + uVar7;
      __s = __s + 4;
      uVar7 = (uVar7 >> 0xb) + uVar7;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  switch(uVar3 & 3) {
  case 0:
    goto switchD_0061674e_caseD_0;
  case 1:
    uVar3 = (uVar7 + (int)*__s) * 0x400 ^ uVar7 + (int)*__s;
    uVar7 = uVar3 >> 1;
    break;
  case 2:
    uVar3 = (uVar7 + *(ushort *)__s) * 0x800 ^ uVar7 + *(ushort *)__s;
    uVar7 = uVar3 >> 0x11;
    break;
  case 3:
    uVar7 = (uVar7 + *(ushort *)__s) * 0x10000 ^ (int)__s[2] << 0x12 ^ uVar7 + *(ushort *)__s;
    uVar3 = uVar7 >> 0xb;
  }
  uVar7 = uVar7 + uVar3;
switchD_0061674e_caseD_0:
  pSVar1 = (input->super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = 0;
  lVar9 = (long)(input->
                super__Vector_base<Assimp::SceneHelper,_std::allocator<Assimp::SceneHelper>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar9 != 0) {
    uVar7 = uVar7 * 8 ^ uVar7;
    uVar7 = (uVar7 >> 5) + uVar7;
    uVar7 = uVar7 * 0x10 ^ uVar7;
    uVar7 = (uVar7 >> 0x11) + uVar7;
    uVar7 = uVar7 * 0x2000000 ^ uVar7;
    _Var6 = (uVar7 >> 6) + uVar7;
    uVar8 = (lVar9 >> 5) * -0x5555555555555555;
    do {
      if ((uint)uVar5 != cur) {
        p_Var10 = *(_Base_ptr *)((long)&pSVar1[uVar5].hashes._M_t._M_impl + 0x10);
        if (p_Var10 != (_Base_ptr)0x0) {
          p_Var12 = (_Base_ptr)((long)&pSVar1[uVar5].hashes._M_t._M_impl + 8);
          p_Var11 = p_Var12;
          do {
            bVar13 = p_Var10[1]._M_color < _Var6;
            if (!bVar13) {
              p_Var11 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[bVar13];
          } while (p_Var10 != (_Base_ptr)0x0);
          if ((p_Var11 != p_Var12) && (p_Var11[1]._M_color <= _Var6)) {
            uVar5 = 1;
            goto LAB_00616830;
          }
        }
      }
      uVar5 = (ulong)((uint)uVar5 + 1);
    } while (uVar5 <= uVar8 && uVar8 - uVar5 != 0);
    uVar5 = 0;
  }
LAB_00616830:
  return SUB81(uVar5,0);
}

Assistant:

bool SceneCombiner::FindNameMatch(const aiString& name, std::vector<SceneHelper>& input, unsigned int cur) {
    const unsigned int hash = SuperFastHash(name.data, static_cast<uint32_t>(name.length));

    // Check whether we find a positive match in one of the given sets
    for (unsigned int i = 0; i < input.size(); ++i) {
        if (cur != i && input[i].hashes.find(hash) != input[i].hashes.end()) {
            return true;
        }
    }
    return false;
}